

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT_internal.c
# Opt level: O0

void FACT_INTERNAL_UpdateEngine(FACTAudioEngine *engine)

{
  float *pfVar1;
  long in_RDI;
  float rpcResult;
  uint16_t par;
  uint16_t j;
  uint16_t i;
  FAudioFXReverbParameters rvbPar;
  void *in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffb4;
  float in_stack_ffffffffffffffb8;
  undefined2 in_stack_ffffffffffffffbc;
  ushort in_stack_ffffffffffffffbe;
  ushort local_40;
  ushort local_3e;
  float in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  for (local_3e = 0; local_3e < *(ushort *)(in_RDI + 0x24); local_3e = local_3e + 1) {
    if ((4 < *(ushort *)(*(long *)(in_RDI + 0x60) + (ulong)local_3e * 0x10 + 4)) &&
       ((*(byte *)(*(long *)(in_RDI + 0x58) +
                  (ulong)*(ushort *)(*(long *)(in_RDI + 0x60) + (ulong)local_3e * 0x10) * 0x10) & 4)
        == 0)) {
      for (local_40 = 0; local_40 < *(ushort *)(in_RDI + 0x26); local_40 = local_40 + 1) {
        in_stack_ffffffffffffffbe =
             *(short *)(*(long *)(in_RDI + 0x60) + (ulong)local_3e * 0x10 + 4) - 5;
        in_stack_ffffffffffffffb8 =
             FACT_INTERNAL_CalculateRPC
                       ((FACTRPC *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                        in_stack_ffffffffffffffe4);
        pfVar1 = (float *)(*(long *)(*(long *)(in_RDI + 0x68) + (ulong)local_40 * 0x10 + 8) +
                           (ulong)in_stack_ffffffffffffffbe * 0x14 + 0xc);
        if (in_stack_ffffffffffffffb8 < *pfVar1 || in_stack_ffffffffffffffb8 == *pfVar1) {
          in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb8;
          if (in_stack_ffffffffffffffb8 <
              *(float *)(*(long *)(*(long *)(in_RDI + 0x68) + (ulong)local_40 * 0x10 + 8) +
                         (ulong)in_stack_ffffffffffffffbe * 0x14 + 8)) {
            in_stack_ffffffffffffffb4 =
                 *(float *)(*(long *)(*(long *)(in_RDI + 0x68) + (ulong)local_40 * 0x10 + 8) +
                            (ulong)in_stack_ffffffffffffffbe * 0x14 + 8);
          }
        }
        else {
          in_stack_ffffffffffffffb4 =
               *(float *)(*(long *)(*(long *)(in_RDI + 0x68) + (ulong)local_40 * 0x10 + 8) +
                          (ulong)in_stack_ffffffffffffffbe * 0x14 + 0xc);
        }
        *(float *)(*(long *)(*(long *)(in_RDI + 0x68) + (ulong)local_40 * 0x10 + 8) +
                   (ulong)in_stack_ffffffffffffffbe * 0x14 + 4) = in_stack_ffffffffffffffb4;
      }
    }
  }
  if (*(long *)(in_RDI + 0xa8) != 0) {
    FAudioVoice_SetEffectParameters
              ((FAudioVoice *)
               CONCAT26(in_stack_ffffffffffffffbe,
                        CONCAT24(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)),
               (uint32_t)in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,0,0x11a82a);
  }
  return;
}

Assistant:

void FACT_INTERNAL_UpdateEngine(FACTAudioEngine *engine)
{
	FAudioFXReverbParameters rvbPar;
	uint16_t i, j, par;
	float rpcResult;
	for (i = 0; i < engine->rpcCount; i += 1)
	{
		if (engine->rpcs[i].parameter >= RPC_PARAMETER_COUNT)
		{
			/* FIXME: Why did I make this global vars only...? */
			if (!(engine->variables[engine->rpcs[i].variable].accessibility & 0x04))
			{
				for (j = 0; j < engine->dspPresetCount; j += 1)
				{
					/* FIXME: This affects all DSP presets!
					 * What if there's more than one?
					 */
					par = engine->rpcs[i].parameter - RPC_PARAMETER_COUNT;
					rpcResult = FACT_INTERNAL_CalculateRPC(
						&engine->rpcs[i],
						engine->globalVariableValues[engine->rpcs[i].variable]
					);
					engine->dspPresets[j].parameters[par].value = FAudio_clamp(
						rpcResult,
						engine->dspPresets[j].parameters[par].minVal,
						engine->dspPresets[j].parameters[par].maxVal
					);
				}
			}
		}
	}

	/* Set Effect parameters from above RPC changes */
	if (engine->reverbVoice != NULL)
	{
		rvbPar.WetDryMix = engine->dspPresets[0].parameters[21].value;
		rvbPar.ReflectionsDelay = (uint32_t) engine->dspPresets[0].parameters[0].value;
		rvbPar.ReverbDelay = (uint8_t) engine->dspPresets[0].parameters[1].value;
		rvbPar.RearDelay = (uint8_t) engine->dspPresets[0].parameters[12].value;
		rvbPar.PositionLeft = (uint8_t) engine->dspPresets[0].parameters[2].value;
		rvbPar.PositionRight = (uint8_t) engine->dspPresets[0].parameters[3].value;
		rvbPar.PositionMatrixLeft = (uint8_t) engine->dspPresets[0].parameters[4].value;
		rvbPar.PositionMatrixRight = (uint8_t) engine->dspPresets[0].parameters[5].value;
		rvbPar.HighEQGain = (uint8_t) engine->dspPresets[0].parameters[10].value;
		rvbPar.LowEQCutoff = (uint8_t) engine->dspPresets[0].parameters[9].value;
		rvbPar.LowEQGain = (uint8_t) engine->dspPresets[0].parameters[8].value;
		rvbPar.LateDiffusion = (uint8_t) engine->dspPresets[0].parameters[7].value;
		rvbPar.EarlyDiffusion = (uint8_t) engine->dspPresets[0].parameters[6].value;
		rvbPar.HighEQCutoff = (uint8_t) engine->dspPresets[0].parameters[11].value;
		rvbPar.RoomFilterMain = engine->dspPresets[0].parameters[14].value;
		rvbPar.RoomFilterFreq = engine->dspPresets[0].parameters[13].value;
		rvbPar.RoomFilterHF = engine->dspPresets[0].parameters[15].value;
		rvbPar.ReflectionsGain = engine->dspPresets[0].parameters[16].value;
		rvbPar.ReverbGain = engine->dspPresets[0].parameters[17].value;
		rvbPar.DecayTime = engine->dspPresets[0].parameters[18].value;
		rvbPar.Density = engine->dspPresets[0].parameters[19].value;
		rvbPar.RoomSize = engine->dspPresets[0].parameters[20].value;

		FAudioVoice_SetEffectParameters(
			engine->reverbVoice,
			0,
			&rvbPar,
			sizeof(FAudioFXReverbParameters),
			0
		);
	}
}